

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# earcut.hpp
# Opt level: O0

Node * __thiscall
mapbox::detail::Earcut<unsigned_int>::findHoleBridge
          (Earcut<unsigned_int> *this,Node *hole,Node *outerNode)

{
  Node *pNVar1;
  double ay;
  double bx;
  double by;
  bool bVar2;
  Earcut<unsigned_int> *pEVar3;
  double dVar4;
  Node *pNVar5;
  double extraout_XMM0_Qa;
  double dVar6;
  Node *local_c0;
  Node *local_90;
  double my;
  double mx;
  double tanCur;
  double tanMin;
  Node *stop;
  double x;
  Node *m;
  double qx;
  double hy;
  double hx;
  Node *p;
  Node *outerNode_local;
  Node *hole_local;
  Earcut<unsigned_int> *this_local;
  
  pNVar1 = (Node *)hole->x;
  ay = hole->y;
  dVar4 = std::numeric_limits<double>::infinity();
  m = (Node *)((ulong)dVar4 ^ 0x8000000000000000);
  x = 0.0;
  hx = (double)outerNode;
  do {
    if ((((ay <= *(double *)((long)hx + 0x10)) &&
         (*(double *)(*(long *)((long)hx + 0x20) + 0x10) <= ay)) &&
        ((dVar4 = *(double *)(*(long *)((long)hx + 0x20) + 0x10),
         dVar4 != *(double *)((long)hx + 0x10) || (NAN(dVar4) || NAN(*(double *)((long)hx + 0x10))))
        )) && ((pNVar5 = (Node *)(*(double *)((long)hx + 8) +
                                 ((ay - *(double *)((long)hx + 0x10)) *
                                 (*(double *)(*(long *)((long)hx + 0x20) + 8) -
                                 *(double *)((long)hx + 8))) /
                                 (*(double *)(*(long *)((long)hx + 0x20) + 0x10) -
                                 *(double *)((long)hx + 0x10))), (double)pNVar5 <= (double)pNVar1 &&
               ((double)m < (double)pNVar5)))) {
      if (*(double *)(*(long *)((long)hx + 0x20) + 8) <= *(double *)((long)hx + 8)) {
        local_90 = *(Node **)((long)hx + 0x20);
      }
      else {
        local_90 = (Node *)hx;
      }
      x = (double)local_90;
      m = pNVar5;
      if (((double)pNVar5 == (double)pNVar1) && (!NAN((double)pNVar5) && !NAN((double)pNVar1))) {
        return local_90;
      }
    }
    dVar4 = x;
    hx = *(double *)((long)hx + 0x20);
  } while ((Node *)hx != outerNode);
  if (x == 0.0) {
    this_local = (Earcut<unsigned_int> *)0x0;
  }
  else {
    tanCur = std::numeric_limits<double>::infinity();
    hx = x;
    bx = *(double *)((long)x + 8);
    by = *(double *)((long)x + 0x10);
    do {
      if (((*(double *)((long)hx + 8) <= (double)pNVar1) && (bx <= *(double *)((long)hx + 8))) &&
         (((double)pNVar1 != *(double *)((long)hx + 8) ||
          (NAN((double)pNVar1) || NAN(*(double *)((long)hx + 8)))))) {
        local_c0 = pNVar1;
        pNVar5 = m;
        if (ay < by) {
          local_c0 = m;
          pNVar5 = pNVar1;
        }
        pEVar3 = this;
        bVar2 = pointInTriangle(this,(double)pNVar5,ay,bx,by,(double)local_c0,ay,
                                *(double *)((long)hx + 8),*(double *)((long)hx + 0x10));
        if (bVar2) {
          std::abs((int)pEVar3);
          dVar6 = extraout_XMM0_Qa / ((double)pNVar1 - *(double *)((long)hx + 8));
          bVar2 = locallyInside(this,(Node *)hx,hole);
          if (bVar2) {
            if (tanCur <= dVar6) {
              if (((dVar6 != tanCur) || (NAN(dVar6) || NAN(tanCur))) ||
                 ((*(double *)((long)hx + 8) < *(double *)((long)x + 8) ||
                   *(double *)((long)hx + 8) == *(double *)((long)x + 8) &&
                  (bVar2 = sectorContainsSector(this,(Node *)x,(Node *)hx), !bVar2))))
              goto LAB_00580130;
            }
            x = hx;
            tanCur = dVar6;
          }
        }
      }
LAB_00580130:
      hx = *(double *)((long)hx + 0x20);
    } while (hx != dVar4);
    this_local = (Earcut<unsigned_int> *)x;
  }
  return (Node *)this_local;
}

Assistant:

typename Earcut<N>::Node*
Earcut<N>::findHoleBridge(Node* hole, Node* outerNode) {
    Node* p = outerNode;
    double hx = hole->x;
    double hy = hole->y;
    double qx = -std::numeric_limits<double>::infinity();
    Node* m = nullptr;

    // find a segment intersected by a ray from the hole's leftmost Vertex to the left;
    // segment's endpoint with lesser x will be potential connection Vertex
    do {
        if (hy <= p->y && hy >= p->next->y && p->next->y != p->y) {
          double x = p->x + (hy - p->y) * (p->next->x - p->x) / (p->next->y - p->y);
          if (x <= hx && x > qx) {
            qx = x;
            m = p->x < p->next->x ? p : p->next;
            if (x == hx) return m; // hole touches outer segment; pick leftmost endpoint
          }
        }
        p = p->next;
    } while (p != outerNode);

    if (!m) return 0;

    // look for points inside the triangle of hole Vertex, segment intersection and endpoint;
    // if there are no points found, we have a valid connection;
    // otherwise choose the Vertex of the minimum angle with the ray as connection Vertex

    const Node* stop = m;
    double tanMin = std::numeric_limits<double>::infinity();
    double tanCur = 0;

    p = m;
    double mx = m->x;
    double my = m->y;

    do {
        if (hx >= p->x && p->x >= mx && hx != p->x &&
            pointInTriangle(hy < my ? hx : qx, hy, mx, my, hy < my ? qx : hx, hy, p->x, p->y)) {

            tanCur = std::abs(hy - p->y) / (hx - p->x); // tangential

            if (locallyInside(p, hole) &&
                (tanCur < tanMin || (tanCur == tanMin && (p->x > m->x || sectorContainsSector(m, p))))) {
                m = p;
                tanMin = tanCur;
            }
        }

        p = p->next;
    } while (p != stop);

    return m;
}